

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall ComponentManager::AddService(ComponentManager *this,CID cid,ISupports *service)

{
  ClassInfo *info;
  
  info = (ClassInfo *)
         operator_new(0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                      ,0xe0);
  (info->mCid).mId = cid.mId;
  info->mClass = service;
  (**service->_vptr_ISupports)(service);
  JetHead::list<ComponentManager::ClassInfo_*>::push_back(&this->mClasses,&info);
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::AddService( CID cid, ISupports *service )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo *info = jh_new ClassInfo( cid, service );
	
	LOG( "Adding cid %s, ISupports %p", cid.toString(), service );
	
	service->AddRef();
	
	mClasses.push_back( info );
	
	return kNoError;
}